

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANN.cpp
# Opt level: O0

MatrixXd * __thiscall ANN::predict(ANN *this,MatrixXd *input)

{
  bool bVar1;
  reference ppLVar2;
  MatrixXd *in_RDI;
  Layer *layer;
  iterator __end1;
  iterator __begin1;
  vector<Layer_*,_std::allocator<Layer_*>_> *__range1;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_ffffffffffffff58;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_ffffffffffffff60;
  undefined1 local_68 [24];
  undefined1 local_50 [24];
  Matrix<double,__1,__1,_0,__1,__1> *local_38;
  Layer **local_30;
  __normal_iterator<Layer_**,_std::vector<Layer_*,_std::allocator<Layer_*>_>_> local_28 [5];
  
  local_28[0]._M_current =
       (Layer **)
       std::vector<Layer_*,_std::allocator<Layer_*>_>::begin
                 ((vector<Layer_*,_std::allocator<Layer_*>_> *)in_stack_ffffffffffffff58);
  local_30 = (Layer **)
             std::vector<Layer_*,_std::allocator<Layer_*>_>::end
                       ((vector<Layer_*,_std::allocator<Layer_*>_> *)in_stack_ffffffffffffff58);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<Layer_**,_std::vector<Layer_*,_std::allocator<Layer_*>_>_>
                        *)in_stack_ffffffffffffff60,
                       (__normal_iterator<Layer_**,_std::vector<Layer_*,_std::allocator<Layer_*>_>_>
                        *)in_stack_ffffffffffffff58);
    if (!bVar1) break;
    ppLVar2 = __gnu_cxx::
              __normal_iterator<Layer_**,_std::vector<Layer_*,_std::allocator<Layer_*>_>_>::
              operator*(local_28);
    in_stack_ffffffffffffff60 = (Matrix<double,__1,__1,_0,__1,__1> *)*ppLVar2;
    local_38 = in_stack_ffffffffffffff60;
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    (*(code *)*(in_stack_ffffffffffffff60->
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data)
              (local_50,in_stack_ffffffffffffff60,local_68);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x14e168)
    ;
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x14e172)
    ;
    __gnu_cxx::__normal_iterator<Layer_**,_std::vector<Layer_*,_std::allocator<Layer_*>_>_>::
    operator++(local_28);
  }
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  return in_RDI;
}

Assistant:

Eigen::MatrixXd ANN::predict(Eigen::MatrixXd input) {
    for(auto layer : layers) {
        input = layer->forward(input);
    }
    return input;
}